

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureFormatTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::Texture2DArrayFormatCase::iterate(Texture2DArrayFormatCase *this)

{
  int iVar1;
  bool bVar2;
  qpTestResult qVar3;
  int iVar4;
  Texture2DArray *this_00;
  bool isOk;
  Texture2DArrayFormatCase *this_local;
  
  bVar2 = testLayer(this,this->m_curLayer);
  if ((!bVar2) &&
     (qVar3 = tcu::TestContext::getTestResult((this->super_TestCase).super_TestNode.m_testCtx),
     qVar3 == QP_TEST_RESULT_PASS)) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Image comparison failed");
  }
  this->m_curLayer = this->m_curLayer + 1;
  iVar1 = this->m_curLayer;
  this_00 = glu::Texture2DArray::getRefTexture(this->m_texture);
  iVar4 = tcu::Texture2DArray::getNumLayers(this_00);
  return (uint)(iVar1 < iVar4);
}

Assistant:

Texture2DArrayFormatCase::IterateResult Texture2DArrayFormatCase::iterate (void)
{
	// Execute test for all layers.
	bool isOk = testLayer(m_curLayer);

	if (!isOk && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");

	m_curLayer += 1;

	return m_curLayer < m_texture->getRefTexture().getNumLayers() ? CONTINUE : STOP;
}